

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

VkDescriptorSet __thiscall
VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
          (VulkanLogicalDevice *this,VkDescriptorSetAllocateInfo *AllocInfo,char *DebugName)

{
  VkResult VVar1;
  char (*in_RCX) [66];
  char *name;
  VkDescriptorSet DescrSet;
  string local_40;
  
  if (AllocInfo->sType != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO) {
    Diligent::FormatString<char[26],char[66]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO",
               in_RCX);
    in_RCX = (char (*) [66])0x1a2;
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AllocateVkDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x1a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (AllocInfo->descriptorSetCount != 1) {
    Diligent::FormatString<char[26],char[34]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.descriptorSetCount == 1",(char (*) [34])in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AllocateVkDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x1a3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  name = "";
  if (DebugName != (char *)0x0) {
    name = DebugName;
  }
  local_40._M_dataplus._M_p = (pointer)0x0;
  VVar1 = (*vkAllocateDescriptorSets)(this->m_VkDevice,AllocInfo,(VkDescriptorSet *)&local_40);
  if (VVar1 == VK_SUCCESS) {
    if (*name != '\0') {
      SetDescriptorSetName(this->m_VkDevice,(VkDescriptorSet)local_40._M_dataplus._M_p,name);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)0x0;
  }
  return (VkDescriptorSet)local_40._M_dataplus._M_p;
}

Assistant:

VkDescriptorSet VulkanLogicalDevice::AllocateVkDescriptorSet(const VkDescriptorSetAllocateInfo& AllocInfo, const char* DebugName) const
{
    VERIFY_EXPR(AllocInfo.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO);
    VERIFY_EXPR(AllocInfo.descriptorSetCount == 1);

    if (DebugName == nullptr)
        DebugName = "";

    VkDescriptorSet DescrSet = VK_NULL_HANDLE;

    VkResult err = vkAllocateDescriptorSets(m_VkDevice, &AllocInfo, &DescrSet);
    if (err != VK_SUCCESS)
        return VK_NULL_HANDLE;

    if (*DebugName != 0)
        SetDescriptorSetName(m_VkDevice, DescrSet, DebugName);

    return DescrSet;
}